

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultReporter.cpp
# Opt level: O0

bool __thiscall
ApprovalTests::DefaultReporter::report(DefaultReporter *this,string *received,string *approved)

{
  int iVar1;
  element_type *peVar2;
  string *in_RDX;
  string *in_RSI;
  string local_78 [48];
  string local_48 [72];
  
  DefaultReporterFactory::getDefaultReporter();
  peVar2 = ::std::
           __shared_ptr_access<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1c2bf5);
  ::std::__cxx11::string::string(local_48,in_RSI);
  ::std::__cxx11::string::string(local_78,in_RDX);
  iVar1 = (*peVar2->_vptr_Reporter[2])(peVar2,local_48,local_78);
  ::std::__cxx11::string::~string(local_78);
  ::std::__cxx11::string::~string(local_48);
  ::std::shared_ptr<ApprovalTests::Reporter>::~shared_ptr
            ((shared_ptr<ApprovalTests::Reporter> *)0x1c2c5b);
  return (bool)((byte)iVar1 & 1);
}

Assistant:

bool DefaultReporter::report(std::string received, std::string approved) const
    {
        return DefaultReporterFactory::getDefaultReporter()->report(received, approved);
    }